

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::check_max_selection_weight::test_method
          (check_max_selection_weight *this)

{
  CFeeRate effective_feerate;
  bool bVar1;
  undefined1 uVar2;
  CCoinControl *cc_00;
  function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup;
  long in_FS_OFFSET;
  int max_weight;
  CAmount target;
  CoinSelectionParams cs_params;
  Result<wallet::SelectionResult> result_2;
  Result<wallet::SelectionResult> result_1;
  Result<wallet::SelectionResult> result;
  FastRandomContext rand;
  CCoinControl cc;
  CFeeRate *in_stack_fffffffffffff6b8;
  char *this_00;
  undefined8 in_stack_fffffffffffff6c0;
  lazy_ostream *prev;
  FastRandomContext *in_stack_fffffffffffff6c8;
  int change_output_size;
  function<wallet::CoinsResult_(wallet::CWallet_&)> *this_01;
  undefined4 uVar3;
  uint in_stack_fffffffffffff6d4;
  _Optional_payload_base<int> amount;
  CFeeRate in_stack_fffffffffffff6e0;
  CFeeRate in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  _Optional_payload_base<int> in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  int in_stack_fffffffffffff730;
  undefined7 in_stack_fffffffffffff770;
  undefined1 in_stack_fffffffffffff777;
  function<wallet::CoinsResult_(wallet::CWallet_&)> *in_stack_fffffffffffff778;
  CCoinControl *in_stack_fffffffffffff780;
  CoinSelectionParams *in_stack_fffffffffffff788;
  CoinSelectionParams *cs_params_00;
  CAmount *in_stack_fffffffffffff790;
  CAmount *target_00;
  const_string local_7d0 [2];
  assertion_result local_790 [4];
  int local_72c;
  undefined1 local_728 [16];
  undefined1 local_718 [64];
  const_string local_6d8 [2];
  lazy_ostream local_6b8 [2];
  assertion_result local_698 [2];
  const_string local_660 [2];
  lazy_ostream local_640 [2];
  assertion_result local_620 [2];
  CAmount local_5e0 [4];
  int local_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  const_string local_568 [2];
  lazy_ostream local_548 [2];
  assertion_result local_528 [2];
  const_string local_4f0 [2];
  lazy_ostream local_4d0 [2];
  assertion_result local_4b0 [4];
  undefined1 local_44c [28];
  undefined8 local_430;
  _Optional_payload_base<int> local_428 [2];
  int local_418;
  int local_3d8;
  long local_8;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffff6c0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_430 = 4950000000;
  CCoinControl::CCoinControl
            ((CCoinControl *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
  FastRandomContext::FastRandomContext(in_stack_fffffffffffff6c8,(bool)uVar2);
  change_output_size = (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20);
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffff6b8,0);
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffff6b8,0);
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffff6b8,0);
  std::optional<int>::optional((optional<int> *)local_428);
  uVar3 = 0;
  this_01 = (function<wallet::CoinsResult_(wallet::CWallet_&)> *)CONCAT44(change_output_size,0x2c);
  effective_feerate.nSatoshisPerK._7_1_ = in_stack_fffffffffffff6f7;
  effective_feerate.nSatoshisPerK._0_7_ = in_stack_fffffffffffff6f0;
  CoinSelectionParams::CoinSelectionParams
            ((CoinSelectionParams *)local_428[0],
             (FastRandomContext *)((ulong)in_stack_fffffffffffff6d4 << 0x20),change_output_size,0x2c
             ,local_44c._4_8_,effective_feerate,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
             in_stack_fffffffffffff730,SUB81(local_44c._12_8_,7),
             (optional<int>)in_stack_fffffffffffff6f8);
  local_44c._0_4_ = (local_3d8 + local_418) * -4 + 400000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::check_max_selection_weight::test_method()::__0,void>
            (this_01,(anon_class_1_0_00000001 *)local_44c._4_8_);
  select_coins(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780,
               in_stack_fffffffffffff778,
               (NodeContext *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)local_44c._12_8_);
  this_00 = (char *)local_44c._12_8_;
  prev = (lazy_ostream *)local_44c._4_8_;
  amount = local_428[0];
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    boost::test_tools::assertion_result::assertion_result<util::Result<wallet::SelectionResult>>
              ((assertion_result *)this_01,(Result<wallet::SelectionResult> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b0,local_4d0,local_4f0,0x5b1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetInputSet((SelectionResult *)this_00);
    has_coin((CoinSet *)CONCAT44(in_stack_fffffffffffff6d4,uVar3),(CAmount)amount);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_528,local_548,local_568,0x5b3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_5bc = SelectionResult::GetWeight((SelectionResult *)this_00);
    this_01 = (function<wallet::CoinsResult_(wallet::CWallet_&)> *)0x1ce07b5;
    prev = (lazy_ostream *)local_44c;
    this_00 = "result->GetWeight()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::le_impl,int,int>
              (local_5a8,local_5b8,0x5b4,1,5,&local_5bc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_00 = local_5e0;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::check_max_selection_weight::test_method()::__1,void>
            (this_01,(anon_class_1_0_00000001 *)prev);
  select_coins(target_00,in_stack_fffffffffffff788,in_stack_fffffffffffff780,
               in_stack_fffffffffffff778,
               (NodeContext *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  do {
    cs_params_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    cc_00 = (CCoinControl *)
            util::Result<wallet::SelectionResult>::operator->
                      ((Result<wallet::SelectionResult> *)this_00);
    coin_setup = (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
                 SelectionResult::GetInputSet((SelectionResult *)this_00);
    uVar2 = has_coin((CoinSet *)CONCAT44(in_stack_fffffffffffff6d4,uVar3),(CAmount)amount);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_640,local_660,0x5cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetInputSet((SelectionResult *)this_00);
    has_coin((CoinSet *)CONCAT44(in_stack_fffffffffffff6d4,uVar3),(CAmount)amount);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_698,local_6b8,local_6d8,0x5cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_72c = SelectionResult::GetWeight((SelectionResult *)this_00);
    this_01 = (function<wallet::CoinsResult_(wallet::CWallet_&)> *)0x1ce07b5;
    prev = (lazy_ostream *)local_44c;
    this_00 = "result->GetWeight()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::le_impl,int,int>
              (local_718,local_728,0x5ce,1,5,&local_72c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::check_max_selection_weight::test_method()::__2,void>
            (this_01,(anon_class_1_0_00000001 *)prev);
  select_coins(target_00,cs_params_00,cc_00,coin_setup,
               (NodeContext *)CONCAT17(uVar2,in_stack_fffffffffffff770));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8.nSatoshisPerK,
               (const_string *)in_stack_fffffffffffff6e0.nSatoshisPerK);
    util::Result::operator_cast_to_bool((Result<wallet::SelectionResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_01,SUB81((ulong)prev >> 0x38,0));
    in_stack_fffffffffffff6f8 =
         (_Optional_payload_base<int>)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_790,(lazy_ostream *)&stack0xfffffffffffff850,local_7d0,0x5e5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_fffffffffffff6f7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff6f7);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  FastRandomContext::~FastRandomContext((FastRandomContext *)this_00);
  CCoinControl::~CCoinControl((CCoinControl *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_max_selection_weight)
{
    const CAmount target = 49.5L * COIN;
    CCoinControl cc;

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/68,
        /*min_change_target=*/CENT,
        /*effective_feerate=*/CFeeRate(0),
        /*long_term_feerate=*/CFeeRate(0),
        /*discard_feerate=*/CFeeRate(0),
        /*tx_noinputs_size=*/10 + 34, // static header size + output size
        /*avoid_partial=*/false,
    };

    int max_weight = MAX_STANDARD_TX_WEIGHT - WITNESS_SCALE_FACTOR * (cs_params.tx_noinputs_size + cs_params.change_output_size);
    {
        // Scenario 1:
        // The actor starts with 1x 50.0 BTC and 1515x 0.033 BTC (~100.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // The 50.0 BTC output should be selected, because the transaction would otherwise be too large

        // Perform selection

        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }

                add_coin(available_coins, wallet, CAmount(50 * COIN), CFeeRate(0), 144, false, 0, true);
                return available_coins;
            },
            m_node);

        BOOST_CHECK(result);
        // Verify that the 50 BTC UTXO was selected, and result is below max_weight
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(50 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 2:

        // The actor starts with 400x 0.0625 BTC and 2000x 0.025 BTC (75.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // A combination of coins should be selected, such that the created transaction is not too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 400; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.0625 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                for (int j = 0; j < 2000; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.025 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.0625 * COIN)));
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.025 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 3:

        // The actor starts with 1515x 0.033 BTC (49.995 BTC total) unspent outputs
        // No results should be returned, because the transaction would be too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        // No results
        // 1515 inputs * 68 bytes = 103,020 bytes
        // 103,020 bytes * 4 = 412,080 weight, which is above the MAX_STANDARD_TX_WEIGHT of 400,000
        BOOST_CHECK(!result);
    }
}